

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O0

bool __thiscall TTTBoard::IsDraw(TTTBoard *this)

{
  int local_1c;
  int local_18;
  int j;
  int i;
  bool draw;
  TTTBoard *this_local;
  
  j._3_1_ = true;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      if (this->m_board[local_18][local_1c] == BLANK) {
        j._3_1_ = false;
      }
    }
  }
  return j._3_1_;
}

Assistant:

bool TTTBoard::IsDraw() const
{
    bool draw = true;

    // Check if every cell is a blank
    for(int i = 0; i < MAX_ROWS; ++i)
    {
        for(int j = 0; j < MAX_COLS; ++j)
        {
            if(m_board[i][j] == BLANK)
                draw = false;
        }
    }

    return draw;
}